

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cnn.h
# Opt level: O2

VariableIndex __thiscall
cnn::ComputationGraph::
add_function<cnn::AffineTransform,std::vector<cnn::VariableIndex,std::allocator<cnn::VariableIndex>>>
          (ComputationGraph *this,
          vector<cnn::VariableIndex,_std::allocator<cnn::VariableIndex>_> *arguments)

{
  Node *this_00;
  vector<cnn::VariableIndex,_std::allocator<cnn::VariableIndex>_> *in_RDX;
  Node *local_28;
  
  *(int *)&(this->nodes).super__Vector_base<cnn::Node_*,_std::allocator<cnn::Node_*>_>._M_impl.
           super__Vector_impl_data._M_start =
       (int)((ulong)((long)(arguments->
                           super__Vector_base<cnn::VariableIndex,_std::allocator<cnn::VariableIndex>_>
                           )._M_impl.super__Vector_impl_data._M_finish -
                    (long)(arguments->
                          super__Vector_base<cnn::VariableIndex,_std::allocator<cnn::VariableIndex>_>
                          )._M_impl.super__Vector_impl_data._M_start) >> 3);
  this_00 = (Node *)operator_new(0x50);
  AffineTransform::
  AffineTransform<std::vector<cnn::VariableIndex,std::allocator<cnn::VariableIndex>>>
            ((AffineTransform *)this_00,in_RDX);
  local_28 = this_00;
  std::vector<cnn::Node*,std::allocator<cnn::Node*>>::emplace_back<cnn::Node*>
            ((vector<cnn::Node*,std::allocator<cnn::Node*>> *)arguments,&local_28);
  set_dim_for_new_node((ComputationGraph *)arguments,(VariableIndex *)this);
  return (VariableIndex)(uint)this;
}

Assistant:

inline VariableIndex ComputationGraph::add_function(const T& arguments) {
  VariableIndex new_node_index(nodes.size());
  nodes.push_back(new Function(arguments));
  set_dim_for_new_node(new_node_index);
  return new_node_index;
}